

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::addImageProcessingQCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  Builder *this_00;
  bool bVar1;
  Op OVar2;
  Id id_00;
  mapped_type *this_01;
  Id texid;
  Decoration decor_local;
  
  this_00 = &this->builder;
  OVar2 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[id]->opCode;
  decor_local = decor;
  if (OVar2 == OpSampledImage) {
    id = spv::Builder::getIdOperand(this_00,id,0);
    OVar2 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[id]->opCode;
  }
  if (OVar2 == OpLoad) {
    id_00 = spv::Builder::getIdOperand(this_00,id,0);
    _texid = CONCAT44(decor_local,id_00);
    bVar1 = hasQCOMImageProceessingDecoration(this,id_00,decor);
    if (!bVar1) {
      spv::Builder::addDecoration(this_00,id_00,decor,-1);
      this_01 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->idToQCOMDecorations,&texid);
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::push_back
                (this_01,&decor_local);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessingQCOMDecoration(spv::Id id, spv::Decoration decor)
{
  spv::Op opc = builder.getOpCode(id);
  if (opc == spv::OpSampledImage) {
    id  = builder.getIdOperand(id, 0);
    opc = builder.getOpCode(id);
  }

  if (opc == spv::OpLoad) {
    spv::Id texid = builder.getIdOperand(id, 0);
    if (!hasQCOMImageProceessingDecoration(texid, decor)) {//
      builder.addDecoration(texid, decor);
      idToQCOMDecorations[texid].push_back(decor);
    }
  }
}